

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int ConnectRPLIDAR(RPLIDAR *pRPLIDAR,char *szCfgFilePath)

{
  RS232PORT *pRS232Port;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  BOOL bProtectionStop;
  char line [1024];
  
  bProtectionStop = 0;
  memset(pRPLIDAR->szCfgFilePath,0,0x100);
  sprintf(pRPLIDAR->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(line,0,0x400);
    memset(pRPLIDAR->szDevPath + 5,0,0xfb);
    builtin_strncpy(pRPLIDAR->szDevPath,"COM1",5);
    pRPLIDAR->BaudRate = 0x1c200;
    pRPLIDAR->timeout = 1000;
    pRPLIDAR->threadperiod = 0x32;
    pRPLIDAR->bSaveRawData = 1;
    pRPLIDAR->bStartScanModeAtStartup = 1;
    pRPLIDAR->ScanMode = 0;
    pRPLIDAR->motordelay = 500;
    pRPLIDAR->motorPWM = 0x294;
    pRPLIDAR->maxhist = 0x400;
    pRPLIDAR->alpha_max_err = 0.01;
    pRPLIDAR->d_max_err = 0.1;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%255s",pRPLIDAR->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRPLIDAR->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRPLIDAR->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRPLIDAR->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRPLIDAR->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRPLIDAR->bStartScanModeAtStartup);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRPLIDAR->ScanMode);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRPLIDAR->motordelay);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRPLIDAR->motorPWM);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRPLIDAR->maxhist);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRPLIDAR->alpha_max_err);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRPLIDAR->d_max_err);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_00176e7c;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_00176e7c:
  if (pRPLIDAR->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pRPLIDAR->threadperiod = 0x32;
  }
  if (pRPLIDAR->ScanMode < 0) {
    puts("Invalid parameter : ScanMode.");
    pRPLIDAR->ScanMode = 0;
  }
  if (pRPLIDAR->motordelay < 0) {
    puts("Invalid parameter : motordelay.");
    pRPLIDAR->motordelay = 500;
  }
  if (0x2000 < (uint)pRPLIDAR->maxhist) {
    puts("Invalid parameter : maxhist.");
    pRPLIDAR->maxhist = 0x400;
  }
  pRS232Port = &pRPLIDAR->RS232Port;
  iVar1 = OpenRS232Port(pRS232Port,pRPLIDAR->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a RPLIDAR.");
    return 1;
  }
  iVar1 = SetOptionsRS232Port(pRS232Port,pRPLIDAR->BaudRate,'\0',0,'\b','\0',pRPLIDAR->timeout);
  if (iVar1 != 0) {
    pcVar2 = "Unable to connect to a RPLIDAR.";
LAB_00176f4a:
    puts(pcVar2);
    goto LAB_00176f4f;
  }
  pRPLIDAR->SerialNumber[0x10] = '\0';
  pRPLIDAR->SerialNumber[0x11] = '\0';
  pRPLIDAR->SerialNumber[0x12] = '\0';
  pRPLIDAR->SerialNumber[0x13] = '\0';
  pRPLIDAR->SerialNumber[0x14] = '\0';
  pRPLIDAR->SerialNumber[0x15] = '\0';
  pRPLIDAR->SerialNumber[0x16] = '\0';
  pRPLIDAR->SerialNumber[0x17] = '\0';
  pRPLIDAR->SerialNumber[0x18] = '\0';
  pRPLIDAR->SerialNumber[0x19] = '\0';
  pRPLIDAR->SerialNumber[0x1a] = '\0';
  pRPLIDAR->SerialNumber[0x1b] = '\0';
  pRPLIDAR->SerialNumber[0x1c] = '\0';
  pRPLIDAR->SerialNumber[0x1d] = '\0';
  pRPLIDAR->SerialNumber[0x1e] = '\0';
  pRPLIDAR->SerialNumber[0x1f] = '\0';
  pRPLIDAR->SerialNumber[0] = '\0';
  pRPLIDAR->SerialNumber[1] = '\0';
  pRPLIDAR->SerialNumber[2] = '\0';
  pRPLIDAR->SerialNumber[3] = '\0';
  pRPLIDAR->SerialNumber[4] = '\0';
  pRPLIDAR->SerialNumber[5] = '\0';
  pRPLIDAR->SerialNumber[6] = '\0';
  pRPLIDAR->SerialNumber[7] = '\0';
  pRPLIDAR->SerialNumber[8] = '\0';
  pRPLIDAR->SerialNumber[9] = '\0';
  pRPLIDAR->SerialNumber[10] = '\0';
  pRPLIDAR->SerialNumber[0xb] = '\0';
  pRPLIDAR->SerialNumber[0xc] = '\0';
  pRPLIDAR->SerialNumber[0xd] = '\0';
  pRPLIDAR->SerialNumber[0xe] = '\0';
  pRPLIDAR->SerialNumber[0xf] = '\0';
  pRPLIDAR->SerialNumber[0x20] = '\0';
  if (pRPLIDAR->bStartScanModeAtStartup == 0) {
    pcVar2 = "";
    goto LAB_00177101;
  }
  GetStartupMessageRPLIDAR(pRPLIDAR);
  iVar1 = StopRequestRPLIDAR(pRPLIDAR);
  if (iVar1 != 0) {
    puts("Warning : RPLIDAR STOP failure.");
  }
  iVar1 = GetInfoRequestRPLIDAR
                    (pRPLIDAR,&pRPLIDAR->model,&pRPLIDAR->hardware,&pRPLIDAR->firmware_major,
                     &pRPLIDAR->firmware_minor,pRPLIDAR->SerialNumber);
  if (iVar1 != 0) {
    puts("Warning : RPLIDAR GET_INFO failure.");
  }
  iVar1 = GetHealthRequestRPLIDAR(pRPLIDAR,&bProtectionStop);
  if (iVar1 != 0) {
    puts("Warning : RPLIDAR GET_HEALTH failure.");
  }
  if (bProtectionStop != 0) {
    iVar1 = ResetRequestRPLIDAR(pRPLIDAR);
    if (iVar1 != 0) {
      pcVar2 = "Unable to connect to a RPLIDAR : RESET failure.";
      goto LAB_00176f4a;
    }
    GetStartupMessageRPLIDAR(pRPLIDAR);
    StopRequestRPLIDAR(pRPLIDAR);
  }
  SetMotorPWMRequestRPLIDAR(pRPLIDAR,pRPLIDAR->motorPWM);
  memset(pRPLIDAR->esdata_prev,0,300);
  iVar1 = pRPLIDAR->ScanMode;
  if (iVar1 == 0xff) {
    iVar1 = StartForceScanRequestRPLIDAR(pRPLIDAR);
    if (iVar1 == 0) goto LAB_001770dc;
    pcVar2 = "Unable to connect to a RPLIDAR : FORCE_SCAN failure.";
  }
  else if (iVar1 == 0xfe) {
    iVar1 = StartExpressScanRequestRPLIDAR(pRPLIDAR);
    if (iVar1 == 0) goto LAB_001770dc;
    pcVar2 = "Unable to connect to a RPLIDAR : EXPRESS_SCAN failure.";
  }
  else if (iVar1 == 0) {
    iVar1 = StartScanRequestRPLIDAR(pRPLIDAR);
    if (iVar1 == 0) {
LAB_001770dc:
      mSleep((long)pRPLIDAR->motordelay);
      pcVar2 = " ";
      if (pRPLIDAR->SerialNumber[0] == '\0') {
        pcVar2 = "";
      }
LAB_00177101:
      printf("RPLIDAR %.32s%.1sconnected.\n",pRPLIDAR->SerialNumber,pcVar2);
      return 0;
    }
    pcVar2 = "Unable to connect to a RPLIDAR : SCAN failure.";
  }
  else {
    iVar1 = StartOtherScanRequestRPLIDAR(pRPLIDAR,iVar1);
    if (iVar1 == 0) goto LAB_001770dc;
    pcVar2 = "Unable to connect to a RPLIDAR : scan mode failure.";
  }
  puts(pcVar2);
  SetMotorPWMRequestRPLIDAR(pRPLIDAR,0);
LAB_00176f4f:
  CloseRS232Port(pRS232Port);
  return 1;
}

Assistant:

inline int ConnectRPLIDAR(RPLIDAR* pRPLIDAR, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[1024];
	BOOL bProtectionStop = FALSE;

	memset(pRPLIDAR->szCfgFilePath, 0, sizeof(pRPLIDAR->szCfgFilePath));
	sprintf(pRPLIDAR->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pRPLIDAR->szDevPath, 0, sizeof(pRPLIDAR->szDevPath));
		sprintf(pRPLIDAR->szDevPath, "COM1");
		pRPLIDAR->BaudRate = 115200;
		pRPLIDAR->timeout = 1000;
		pRPLIDAR->threadperiod = 50;
		pRPLIDAR->bSaveRawData = 1;
		pRPLIDAR->bStartScanModeAtStartup = 1;
		pRPLIDAR->ScanMode = SCAN_MODE_RPLIDAR;
		pRPLIDAR->motordelay = 500;
		pRPLIDAR->motorPWM = DEFAULT_MOTOR_PWM_RPLIDAR;
		pRPLIDAR->maxhist = 1024;
		pRPLIDAR->alpha_max_err = 0.01;
		pRPLIDAR->d_max_err = 0.1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pRPLIDAR->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->bStartScanModeAtStartup) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->ScanMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->motordelay) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->motorPWM) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRPLIDAR->maxhist) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRPLIDAR->alpha_max_err) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRPLIDAR->d_max_err) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pRPLIDAR->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pRPLIDAR->threadperiod = 50;
	}
	if (pRPLIDAR->ScanMode < 0)
	{
		printf("Invalid parameter : ScanMode.\n");
		pRPLIDAR->ScanMode = SCAN_MODE_RPLIDAR;
	}
	if (pRPLIDAR->motordelay < 0)
	{
		printf("Invalid parameter : motordelay.\n");
		pRPLIDAR->motordelay = 500;
	}
	if ((pRPLIDAR->maxhist < 0)||(pRPLIDAR->maxhist > MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR))
	{
		printf("Invalid parameter : maxhist.\n");
		pRPLIDAR->maxhist = 1024;
	}

	// Used to save raw data, should be handled specifically...
	//pRPLIDAR->pfSaveFile = NULL;

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
	_u32 drvtype = CHANNEL_TYPE_SERIALPORT;
#else
	int drvtype = CHANNEL_TYPE_SERIALPORT;
#endif // FORCE_RPLIDAR_SDK_V1
	char address[256];
	char port[256];
	int iport = 0, ilport = 0;
	char* ptr = NULL;
	char* ptr2 = NULL;

	memset(address, 0, sizeof(address));
	memset(port, 0, sizeof(port));

	// Try to determine whether it is a server TCP port (e.g. :4001), client IP address and TCP port (e.g. 127.0.0.1:4001), 
	// IP address and UDP ports (e.g. udp://127.0.0.1:4001:4002) or local RS232 port.
	ptr = strchr(pRPLIDAR->szDevPath, ':');
	if ((ptr != NULL)&&(strlen(ptr) >= 6)) ptr2 = strchr(ptr+1, ':');
	if ((strlen(pRPLIDAR->szDevPath) >= 12)&&(strncmp(pRPLIDAR->szDevPath, "tcpsrv://", strlen("tcpsrv://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pRPLIDAR->szDevPath+9, ptr2-(pRPLIDAR->szDevPath+9));
		strcpy(port, ptr2+1);
		drvtype = CHANNEL_TYPE_TCP;
	}
	else if ((strlen(pRPLIDAR->szDevPath) >= 9)&&(strncmp(pRPLIDAR->szDevPath, "tcp://", strlen("tcp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pRPLIDAR->szDevPath+6, ptr2-(pRPLIDAR->szDevPath+6));
		strcpy(port, ptr2+1);
		drvtype = CHANNEL_TYPE_TCP;
	}
	else if ((strlen(pRPLIDAR->szDevPath) >= 9)&&(strncmp(pRPLIDAR->szDevPath, "udp://", strlen("udp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		memcpy(address, pRPLIDAR->szDevPath+6, ptr2-(pRPLIDAR->szDevPath+6));
		sscanf(ptr2, ":%d:%d", &iport, &ilport);
#ifdef FORCE_RPLIDAR_SDK_V1
		printf("Unable to connect to a RPLIDAR : Not implemented.\n");
		return EXIT_NOT_IMPLEMENTED;
#else
		drvtype = CHANNEL_TYPE_UDP;
#endif // FORCE_RPLIDAR_SDK_V1
	}
	else if ((strlen(pRPLIDAR->szDevPath) >= 5)&&(strncmp(pRPLIDAR->szDevPath, "tcp:", strlen("tcp:")) == 0)&&(atoi(pRPLIDAR->szDevPath+4) > 0))
	{
		strcpy(address, "0.0.0.0");
		strcpy(port, pRPLIDAR->szDevPath+4);
		drvtype = CHANNEL_TYPE_TCP;
	}
	else if ((pRPLIDAR->szDevPath[0] == ':')&&(atoi(pRPLIDAR->szDevPath+1) > 0))
	{
		strcpy(address, "0.0.0.0");
		strcpy(port, pRPLIDAR->szDevPath+1);
		drvtype = CHANNEL_TYPE_TCP;
	}
	else if ((ptr != NULL)&&(ptr[1] != 0))
	{
		memcpy(address, pRPLIDAR->szDevPath, ptr-pRPLIDAR->szDevPath);
		strcpy(port, ptr+1);
		drvtype = CHANNEL_TYPE_TCP;
	}
	else
	{
		strcpy(address, pRPLIDAR->szDevPath);
		sprintf(port, "%d", pRPLIDAR->BaudRate);
		drvtype = CHANNEL_TYPE_SERIALPORT;
	}

#ifdef FORCE_RPLIDAR_SDK_V1
	pRPLIDAR->drv = RPlidarDriver::CreateDriver(drvtype);
#else
	pRPLIDAR->drv = *createLidarDriver();
#endif // FORCE_RPLIDAR_SDK_V1
	if (!pRPLIDAR->drv)
	{
		printf("Unable to connect to a RPLIDAR.\n");
		return EXIT_FAILURE;
	}
	
#ifdef FORCE_RPLIDAR_SDK_V1
	if (IS_FAIL(pRPLIDAR->drv->connect(address, atoi(port))))
	{
		printf("Unable to connect to a RPLIDAR.\n");
		RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
		return EXIT_FAILURE;
	}

	if (IS_FAIL(pRPLIDAR->drv->startMotor()))
	{
		printf("Unable to connect to a RPLIDAR.\n");
		pRPLIDAR->drv->disconnect();
		RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
		return EXIT_FAILURE;
	}
#else
	if (drvtype == CHANNEL_TYPE_SERIALPORT)
	{
		pRPLIDAR->channel = *createSerialPortChannel(address, atoi(port));
	}
	else if (drvtype == CHANNEL_TYPE_TCP)
	{
		pRPLIDAR->channel = *createTcpChannel(address, atoi(port));
	}
	else if (drvtype == CHANNEL_TYPE_UDP)
	{
		pRPLIDAR->channel = *createUdpChannel(address, atoi(port));
	}
	else
	{
		printf("Unable to connect to a RPLIDAR.\n");
		delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
		return EXIT_FAILURE;
	}

	if (!pRPLIDAR->channel)
	{
		printf("Unable to connect to a RPLIDAR.\n");
		delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
		return EXIT_FAILURE;
	}

	if (SL_IS_FAIL(pRPLIDAR->drv->connect(pRPLIDAR->channel)))
	{
		printf("Unable to connect to a RPLIDAR.\n");
		delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
		delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
		return EXIT_FAILURE;
	}

	// startMotor() probably only necessary for old versions of the SDK...
	// startMotor() equivalent from https://github.com/Slamtec/sllidar_ros2/blob/main/src/sllidar_node.cpp...
	//if (SL_IS_FAIL(pRPLIDAR->drv->setMotorSpeed()))
	//{
	//	printf("Unable to connect to a RPLIDAR : setMotorSpeed() failed. \n");
	//	return EXIT_FAILURE;
	//}
	//if (SL_IS_FAIL(pRPLIDAR->drv->startScan(0,1)))
	//{
	//	printf("Unable to connect to a RPLIDAR : startScan() failed. \n");
	//	return EXIT_FAILURE;
	//}
#endif // FORCE_RPLIDAR_SDK_V1
#else
	if (OpenRS232Port(&pRPLIDAR->RS232Port, pRPLIDAR->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RPLIDAR.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pRPLIDAR->RS232Port, pRPLIDAR->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pRPLIDAR->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RPLIDAR.\n");
		CloseRS232Port(&pRPLIDAR->RS232Port);
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	pRPLIDAR->nodes_cache = new std::deque<sl_lidar_response_measurement_node_hq_t>();
	if (!pRPLIDAR->nodes_cache)
	{
		printf("Unable to connect to a RPLIDAR : Out of memory. .\n");
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
		pRPLIDAR->drv->stopMotor();
		pRPLIDAR->drv->disconnect();
		RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
		//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
		pRPLIDAR->drv->disconnect();
		delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
		delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
		CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
		return EXIT_OUT_OF_MEMORY;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	memset(pRPLIDAR->SerialNumber, 0, sizeof(pRPLIDAR->SerialNumber));

	if (pRPLIDAR->bStartScanModeAtStartup)
	{
		GetStartupMessageRPLIDAR(pRPLIDAR);

		// Stop any currently running scan.
		if (StopRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
		{
			printf("Warning : RPLIDAR STOP failure.\n");
		}

		if (GetInfoRequestRPLIDAR(pRPLIDAR, &pRPLIDAR->model, &pRPLIDAR->hardware, &pRPLIDAR->firmware_major, &pRPLIDAR->firmware_minor, pRPLIDAR->SerialNumber) != EXIT_SUCCESS)
		{
			printf("Warning : RPLIDAR GET_INFO failure.\n");
		}

		if (GetHealthRequestRPLIDAR(pRPLIDAR, &bProtectionStop) != EXIT_SUCCESS)
		{
			printf("Warning : RPLIDAR GET_HEALTH failure.\n");
		}

		if (bProtectionStop)
		{
			if (ResetRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a RPLIDAR : RESET failure.\n");
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
				delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
				pRPLIDAR->drv->stopMotor();
				pRPLIDAR->drv->disconnect();
				RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
				//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
				pRPLIDAR->drv->disconnect();
				delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
				delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
				CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
				return EXIT_FAILURE;
			}
			GetStartupMessageRPLIDAR(pRPLIDAR);
			StopRequestRPLIDAR(pRPLIDAR);
		}

		// Incompatible with old RPLIDAR...
		//if (GetSampleRateRequestRPLIDAR(pRPLIDAR, &pRPLIDAR->Tstandard, &pRPLIDAR->Texpress) != EXIT_SUCCESS)
		//{
		//	printf("Unable to connect to a RPLIDAR : GET_SAMPLERATE failure.\n");
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
		//	delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
		//	pRPLIDAR->drv->stopMotor();
		//	pRPLIDAR->drv->disconnect();
		//	RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
		//	//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
		//	pRPLIDAR->drv->disconnect();
		//	delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
		//	delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
		//	CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
		//	return EXIT_FAILURE;
		//}

		SetMotorPWMRequestRPLIDAR(pRPLIDAR, pRPLIDAR->motorPWM);

		memset(pRPLIDAR->esdata_prev, 0, sizeof(pRPLIDAR->esdata_prev));
		memset(pRPLIDAR->eesdata_prev, 0, sizeof(pRPLIDAR->eesdata_prev));
		memset(pRPLIDAR->desdata_prev, 0, sizeof(pRPLIDAR->desdata_prev));
		switch (pRPLIDAR->ScanMode)
		{
		case SCAN_MODE_RPLIDAR:
			if (StartScanRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a RPLIDAR : SCAN failure.\n");
				SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
				delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
				pRPLIDAR->drv->stopMotor();
				pRPLIDAR->drv->disconnect();
				RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
				//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
				pRPLIDAR->drv->disconnect();
				delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
				delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
				CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
				return EXIT_FAILURE;
			}
			break;
		case LEGACY_EXPRESS_SCAN_MODE_RPLIDAR:
			if (StartExpressScanRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a RPLIDAR : EXPRESS_SCAN failure.\n");
				SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
				delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
				pRPLIDAR->drv->stopMotor();
				pRPLIDAR->drv->disconnect();
				RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
				//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
				pRPLIDAR->drv->disconnect();
				delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
				delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
				CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
				return EXIT_FAILURE;
			}
			break;
		// Force scan is a special case...
		case FORCE_SCAN_MODE_RPLIDAR:
			if (StartForceScanRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a RPLIDAR : FORCE_SCAN failure.\n");
				SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
				delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
				pRPLIDAR->drv->stopMotor();
				pRPLIDAR->drv->disconnect();
				RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
				//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
				pRPLIDAR->drv->disconnect();
				delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
				delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
				CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
				return EXIT_FAILURE;
			}
			break;
		default:
			if (StartOtherScanRequestRPLIDAR(pRPLIDAR, pRPLIDAR->ScanMode) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a RPLIDAR : scan mode failure.\n");
				SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
				delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
				pRPLIDAR->drv->stopMotor();
				pRPLIDAR->drv->disconnect();
				RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
				//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
				pRPLIDAR->drv->disconnect();
				delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
				delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
				CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
				return EXIT_FAILURE;
			}
			break;
		}

		// Wait for the motor rotation to become stable.
		mSleep(pRPLIDAR->motordelay);
	}

	printf("RPLIDAR %.32s%.1sconnected.\n", pRPLIDAR->SerialNumber, (pRPLIDAR->SerialNumber[0])? " ": "\0");

	return EXIT_SUCCESS;
}